

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ManComputeEstRefs(Mpm_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  Mig_Man_t *pMVar3;
  long lVar4;
  
  if (p->fMainRun != 0) {
    piVar1 = (p->vMapRefs).pArray;
    piVar2 = (p->vEstRefs).pArray;
    pMVar3 = p->pMig;
    for (lVar4 = 0; lVar4 < pMVar3->nObjs; lVar4 = lVar4 + 1) {
      piVar2[lVar4] = (piVar1[lVar4] * 100 + piVar2[lVar4]) / 2;
    }
    return;
  }
  __assert_fail("p->fMainRun",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                ,0x2db,"void Mpm_ManComputeEstRefs(Mpm_Man_t *)");
}

Assistant:

static inline void Mpm_ManComputeEstRefs( Mpm_Man_t * p )
{
    int * pMapRefs  = Vec_IntArray( &p->vMapRefs );
    int * pEstRefs  = Vec_IntArray( &p->vEstRefs );
    int i;
    assert( p->fMainRun );
//  pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    for ( i = 0; i < Mig_ManObjNum(p->pMig); i++ )
        pEstRefs[i] = (1 * pEstRefs[i] + MPM_UNIT_REFS * pMapRefs[i]) / 2;
}